

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O3

int __thiscall
SslTcpSocketImpl::DatenDecode
          (SslTcpSocketImpl *this,uint8_t *buffer,size_t nAnzahl,bool *bZeroReceived)

{
  mutex *pmVar1;
  atomic<unsigned_long> *paVar2;
  SslConnection *this_00;
  _Map_pointer pptVar3;
  _Elt_pointer ptVar4;
  unsigned_long uVar5;
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> _Var6;
  _Alloc_hider __n;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *szBuffer;
  uint8_t *szBuffer_00;
  pointer szBuffer_01;
  SSL *pSVar12;
  wstring *pwVar13;
  pointer *__ptr;
  unsigned_long __n2;
  unique_lock<std::mutex> lock1_1;
  size_t len;
  unique_lock<std::mutex> lock1;
  size_t anz;
  int iErrorHint;
  unique_lock<std::mutex> lock;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_178;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_168;
  uint8_t *local_148;
  bool *local_140;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_138;
  int local_114;
  _Head_base<0UL,_unsigned_char_*,_false> local_110;
  size_t local_108;
  size_t local_100;
  unique_lock<std::mutex> local_f8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_e8;
  uint8_t *local_c8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_c0;
  unique_lock<std::mutex> local_a0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_90;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  if (nAnzahl == 0 || buffer == (uint8_t *)0x0) {
    return 0;
  }
  local_110._M_head_impl = (uchar *)&this->m_mxEnDecode;
  local_a0._M_owns = false;
  local_a0._M_device = (mutex_type *)local_110._M_head_impl;
  std::unique_lock<std::mutex>::lock(&local_a0);
  local_a0._M_owns = true;
  local_100 = nAnzahl;
  local_c8 = buffer;
  local_108 = OpenSSLWrapper::SslConnection::SslPutInData
                        ((this->m_pSslCon)._M_t.
                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl
                         ,buffer,nAnzahl);
  std::unique_lock<std::mutex>::unlock(&local_a0);
  iVar9 = -1;
  if (this->m_bCloseReq == false) {
    iVar8 = OpenSSLWrapper::SslConnection::SSLGetShutdown
                      ((this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    this_00 = (this->m_pSslCon)._M_t.
              super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
              ._M_t.
              super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
              .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
    if (iVar8 < 2) {
      iVar8 = OpenSSLWrapper::SslConnection::SslInitFinished(this_00);
      this->m_iSslInit = iVar8;
      if (iVar8 == 0) {
        iVar9 = OpenSSLWrapper::SslConnection::SSLDoHandshake
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        this->m_iSslInit = iVar9;
        local_f8._M_device = (mutex_type *)local_110._M_head_impl;
        local_f8._M_owns = false;
        local_140 = bZeroReceived;
        std::unique_lock<std::mutex>::lock(&local_f8);
        local_f8._M_owns = true;
        sVar11 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                           ((this->m_pSslCon)._M_t.
                            super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                            _M_head_impl);
        if (sVar11 == 0) {
          bVar7 = false;
        }
        else {
          pmVar1 = &(this->super_TcpSocketImpl).m_mxOutDeque;
          bVar7 = false;
          do {
            szBuffer = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                        *)operator_new__(sVar11);
            memset(szBuffer,0,sVar11);
            local_188._0_8_ = szBuffer;
            local_168._M_dataplus._M_p =
                 (pointer)OpenSSLWrapper::SslConnection::SslGetOutData
                                    ((this->m_pSslCon)._M_t.
                                     super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                     _M_head_impl,(uint8_t *)&szBuffer->_M_allocated_capacity,sVar11
                                    );
            if (local_168._M_dataplus._M_p != (pointer)0x0) {
              iVar9 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
              if (iVar9 != 0) {
                std::__throw_system_error(iVar9);
              }
              LOCK();
              paVar2 = &(this->super_TcpSocketImpl).m_atOutBytes;
              (paVar2->super___atomic_base<unsigned_long>)._M_i =
                   (__int_type)
                   ((paVar2->super___atomic_base<unsigned_long>)._M_i +
                   (long)local_168._M_dataplus._M_p);
              UNLOCK();
              std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
              ::
              emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                        ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                          *)&(this->super_TcpSocketImpl).m_quOutData,
                         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         local_188,(unsigned_long *)&local_168);
              pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
              bVar7 = true;
            }
            sVar11 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                               ((this->m_pSslCon)._M_t.
                                super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                _M_head_impl);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_188._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)0x0) {
              operator_delete__((void *)local_188._0_8_);
            }
          } while (sVar11 != 0);
        }
        std::unique_lock<std::mutex>::unlock(&local_f8);
        if (bVar7) {
          TcpSocketImpl::TriggerWriteThread(&this->super_TcpSocketImpl);
        }
        if (this->m_iSslInit < 1) {
          uVar10 = OpenSSLWrapper::SslConnection::SSLGetError
                             ((this->m_pSslCon)._M_t.
                              super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                              .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                              _M_head_impl,this->m_iSslInit);
          if (uVar10 != 2) {
            (this->super_TcpSocketImpl).super_BaseSocketImpl.m_iError = uVar10 | 0x80000000;
            (this->super_TcpSocketImpl).super_BaseSocketImpl.m_iErrLoc = 0xe;
            __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                      (&local_50,vswprintf,0x10,L"%d",(ulong)uVar10);
            std::operator+(&local_c0,L"SSL_error: ",&local_50);
            pwVar13 = (wstring *)std::__cxx11::wstring::append((wchar_t *)&local_c0);
            std::__cxx11::wstring::wstring((wstring *)&local_e8,pwVar13);
            __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                      (&local_70,vswprintf,0x10,L"%d",(ulong)(uint)this->m_iSslInit);
            std::operator+(&local_138,&local_e8,&local_70);
            pwVar13 = (wstring *)std::__cxx11::wstring::append((wchar_t *)&local_138);
            std::__cxx11::wstring::wstring((wstring *)&local_168,pwVar13);
            pSVar12 = OpenSSLWrapper::SslConnection::operator()
                                ((this->m_pSslCon)._M_t.
                                 super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                 .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                 _M_head_impl);
            __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                      (&local_90,vswprintf,0x20,L"%lu",pSVar12);
            std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)local_188,&local_168,&local_90);
            OutputDebugString((wchar_t *)local_188._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_188._0_8_ != &local_178) {
              operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,
                              local_90.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,
                              local_168.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,
                              local_138.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,
                              local_70.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,
                              local_e8.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)CONCAT44(local_c0._M_dataplus._M_p._4_4_,local_c0._M_dataplus._M_p._0_4_) !=
                &local_c0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_c0._M_dataplus._M_p._4_4_,
                                       local_c0._M_dataplus._M_p._0_4_),
                              local_c0.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,
                              local_50.field_2._M_allocated_capacity * 4 + 4);
            }
            OpenSSLWrapper::SslConnection::GetSslErrAsString_abi_cxx11_
                      ((string *)&local_168,
                       (this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_188,", msg: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_168);
            OutputDebugStringA((char *)local_188._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_188._0_8_ != &local_178) {
              operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
            }
            iVar9 = -1;
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1
                             );
            }
            if ((this->super_TcpSocketImpl).super_BaseSocketImpl.m_fErrorParam.super__Function_base.
                _M_manager == (_Manager_type)0x0) {
              if ((this->super_TcpSocketImpl).super_BaseSocketImpl.m_fError.super__Function_base.
                  _M_manager != (_Manager_type)0x0) {
                local_188._0_8_ = (this->super_TcpSocketImpl).super_BaseSocketImpl.m_pBkRef;
                (*(this->super_TcpSocketImpl).super_BaseSocketImpl.m_fError._M_invoker)
                          ((_Any_data *)&(this->super_TcpSocketImpl).super_BaseSocketImpl.m_fError,
                           (BaseSocket **)local_188);
              }
            }
            else {
              std::function<void_(BaseSocket_*,_void_*)>::operator()
                        (&(this->super_TcpSocketImpl).super_BaseSocketImpl.m_fErrorParam,
                         (this->super_TcpSocketImpl).super_BaseSocketImpl.m_pBkRef,
                         (this->super_TcpSocketImpl).super_BaseSocketImpl.m_pvUserData);
            }
            std::unique_lock<std::mutex>::~unique_lock(&local_f8);
            goto LAB_0010f20b;
          }
        }
        else {
          if ((this->m_fClientConnectedParam).super__Function_base._M_manager != (_Manager_type)0x0)
          {
            std::function<void_(TcpSocket_*,_void_*)>::operator()
                      (&this->m_fClientConnectedParam,
                       (TcpSocket *)(this->super_TcpSocketImpl).super_BaseSocketImpl.m_pBkRef,
                       (this->super_TcpSocketImpl).super_BaseSocketImpl.m_pvUserData);
          }
          if ((this->m_fClientConnected).super__Function_base._M_manager != (_Manager_type)0x0) {
            local_188._0_8_ = (this->super_TcpSocketImpl).super_BaseSocketImpl.m_pBkRef;
            (*(this->m_fClientConnected)._M_invoker)
                      ((_Any_data *)&this->m_fClientConnected,(TcpSocket **)local_188);
          }
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_f8);
        iVar8 = this->m_iSslInit;
        bZeroReceived = local_140;
      }
      iVar9 = -1;
      if (iVar8 == 1) {
        szBuffer_00 = (uint8_t *)operator_new__(0xffff);
        memset(szBuffer_00,0,0xffff);
        local_c0._M_dataplus._M_p._0_4_ = 0;
        local_148 = szBuffer_00;
        local_168._M_dataplus._M_p =
             (pointer)OpenSSLWrapper::SslConnection::SslRead
                                ((this->m_pSslCon)._M_t.
                                 super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                 .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                 _M_head_impl,szBuffer_00,0xffff,(int *)&local_c0);
        local_140 = bZeroReceived;
        if (local_168._M_dataplus._M_p == (pointer)0x0) {
          local_114 = -1;
          local_168._M_dataplus._M_p = (pointer)0x0;
        }
        else {
          pmVar1 = &(this->super_TcpSocketImpl).m_mxInDeque;
          do {
            __n._M_p = local_168._M_dataplus._M_p;
            local_188._0_8_ = operator_new__((ulong)local_168._M_dataplus._M_p);
            memcpy((void *)local_188._0_8_,local_148,(size_t)__n._M_p);
            iVar9 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
            if (iVar9 != 0) {
              std::__throw_system_error(iVar9);
            }
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
            ::
            emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                      ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                        *)&(this->super_TcpSocketImpl).m_quInData,
                       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       local_188,(unsigned_long *)&local_168);
            LOCK();
            paVar2 = &(this->super_TcpSocketImpl).m_atInBytes;
            (paVar2->super___atomic_base<unsigned_long>)._M_i =
                 (__int_type)
                 ((paVar2->super___atomic_base<unsigned_long>)._M_i +
                 (long)local_168._M_dataplus._M_p);
            UNLOCK();
            pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
            local_168._M_dataplus._M_p =
                 (pointer)OpenSSLWrapper::SslConnection::SslRead
                                    ((this->m_pSslCon)._M_t.
                                     super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                     _M_head_impl,local_148,0xffff,(int *)&local_c0);
            if ((uchar *)local_188._0_8_ != (uchar *)0x0) {
              operator_delete__((void *)local_188._0_8_);
            }
          } while (local_168._M_dataplus._M_p != (pointer)0x0);
          local_114 = 1;
        }
        local_188._0_8_ = local_110._M_head_impl;
        local_188[8] = false;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_188);
        local_188[8] = true;
        sVar11 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                           ((this->m_pSslCon)._M_t.
                            super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                            _M_head_impl);
        if (sVar11 == 0) {
          bVar7 = false;
        }
        else {
          pmVar1 = &(this->super_TcpSocketImpl).m_mxOutDeque;
          bVar7 = false;
          do {
            szBuffer_01 = (pointer)operator_new__(sVar11);
            memset(szBuffer_01,0,sVar11);
            local_138._M_dataplus._M_p = szBuffer_01;
            local_e8._M_dataplus._M_p =
                 (pointer)OpenSSLWrapper::SslConnection::SslGetOutData
                                    ((this->m_pSslCon)._M_t.
                                     super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                     _M_head_impl,(uint8_t *)szBuffer_01,sVar11);
            if (local_e8._M_dataplus._M_p != (pointer)0x0) {
              iVar9 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
              if (iVar9 != 0) {
                std::__throw_system_error(iVar9);
              }
              LOCK();
              paVar2 = &(this->super_TcpSocketImpl).m_atOutBytes;
              (paVar2->super___atomic_base<unsigned_long>)._M_i =
                   (__int_type)
                   ((paVar2->super___atomic_base<unsigned_long>)._M_i +
                   (long)local_e8._M_dataplus._M_p);
              UNLOCK();
              std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
              ::
              emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                        ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                          *)&(this->super_TcpSocketImpl).m_quOutData,
                         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         &local_138,(unsigned_long *)&local_e8);
              pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
              bVar7 = true;
            }
            sVar11 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                               ((this->m_pSslCon)._M_t.
                                super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                _M_head_impl);
            if (local_138._M_dataplus._M_p != (pointer)0x0) {
              operator_delete__(local_138._M_dataplus._M_p);
            }
          } while (sVar11 != 0);
        }
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_188);
        if (bVar7) {
          TcpSocketImpl::TriggerWriteThread(&this->super_TcpSocketImpl);
        }
        pmVar1 = &(this->super_TcpSocketImpl).m_mxOutDeque;
        iVar9 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
        if (iVar9 != 0) {
          std::__throw_system_error(iVar9);
        }
        while (pptVar3 = (this->super_TcpSocketImpl).m_quTmpOutData.
                         super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node,
              ptVar4 = (this->super_TcpSocketImpl).m_quTmpOutData.
                       super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur,
              ((long)(this->super_TcpSocketImpl).m_quTmpOutData.
                     super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last - (long)ptVar4 >> 4) +
              ((long)(this->super_TcpSocketImpl).m_quTmpOutData.
                     super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)(this->super_TcpSocketImpl).m_quTmpOutData.
                     super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
              ((((ulong)((long)pptVar3 -
                        (long)(this->super_TcpSocketImpl).m_quTmpOutData.
                              super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
              (ulong)(pptVar3 == (_Map_pointer)0x0)) * 0x20 != 0) {
          uVar5 = (ptVar4->
                  super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
                  ).super__Tuple_impl<1UL,_unsigned_long>.
                  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
          _Var6.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (ptVar4->
               super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
               ).
               super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
               ._M_head_impl._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>;
          (ptVar4->
          super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>
          ).
          super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
          ._M_head_impl._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false> =
               (_Head_base<0UL,_unsigned_char_*,_false>)0x0;
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
          ::pop_front(&(this->super_TcpSocketImpl).m_quTmpOutData);
          pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
          (*(this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[0x14])
                    (this,_Var6.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,uVar5);
          iVar9 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
          if (iVar9 != 0) {
            std::__throw_system_error(iVar9);
          }
          if (_Var6.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) {
            operator_delete__((void *)_Var6.super__Head_base<0UL,_unsigned_char_*,_false>.
                                      _M_head_impl);
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
        bVar7 = OpenSSLWrapper::SslConnection::GetZeroReceived
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        bZeroReceived = local_140;
        *local_140 = bVar7;
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_188);
        operator_delete__(local_148);
        iVar9 = local_114;
      }
      local_100 = local_100 - local_108;
      if (local_100 != 0 && local_108 != 0) {
        pSVar12 = OpenSSLWrapper::SslConnection::operator()
                            ((this->m_pSslCon)._M_t.
                             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                             _M_head_impl);
        __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                  (&local_138,vswprintf,0x20,L"%lu",pSVar12);
        pwVar13 = (wstring *)
                  std::__cxx11::wstring::replace((ulong)&local_138,0,(wchar_t *)0x0,0x133740);
        sVar11 = local_100;
        std::__cxx11::wstring::wstring((wstring *)&local_168,pwVar13);
        pwVar13 = (wstring *)std::__cxx11::wstring::append((wchar_t *)&local_168);
        std::__cxx11::wstring::wstring((wstring *)local_188,pwVar13);
        OutputDebugString((wchar_t *)local_188._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_188._0_8_ != &local_178) {
          operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity * 4 + 4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        iVar9 = DatenDecode(this,local_c8 + local_108,sVar11,bZeroReceived);
      }
    }
    else {
      OpenSSLWrapper::SslConnection::ShutDownConnection(this_00,(int *)0x0);
      (*(this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[2])(this);
    }
  }
LAB_0010f20b:
  std::unique_lock<std::mutex>::~unique_lock(&local_a0);
  return iVar9;
}

Assistant:

int SslTcpSocketImpl::DatenDecode(const uint8_t* buffer, size_t nAnzahl, bool& bZeroReceived)
{
    if (buffer == nullptr || nAnzahl == 0)
        return 0;

    unique_lock<mutex> lock(m_mxEnDecode);
    const size_t nPut = m_pSslCon->SslPutInData(reinterpret_cast<const uint8_t*>(buffer), nAnzahl);
    lock.unlock();

    if (m_bCloseReq == true)
        return -1;

    if (m_pSslCon->SSLGetShutdown() >= SSL_RECEIVED_SHUTDOWN)
    {
        m_pSslCon->ShutDownConnection();
        Close();
        return -1;
    }

    m_iSslInit = m_pSslCon->SslInitFinished();
    if (m_iSslInit == 0)
    {
        m_iSslInit = m_pSslCon->SSLDoHandshake();

        bool bNewData = false;
        unique_lock<mutex> lock1(m_mxEnDecode);
        // Get the out Que of the openssl bio, the buffer is already encrypted
        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (len > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += len;
                m_quOutData.emplace_back(move(temp), len);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }
        lock1.unlock();

        if (bNewData == true)
            TriggerWriteThread();

        if (m_iSslInit <= 0)
        {
            const int iError = m_pSslCon->SSLGetError(m_iSslInit);
            if (iError != SSL_ERROR_WANT_READ)
            {
                m_iError = 0x80000000 | iError;
                m_iErrLoc = 14;
                OutputDebugString(wstring(L"SSL_error: " + to_wstring(iError) + L", after SSL_do_handshake returned: " + to_wstring(m_iSslInit) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)()))).c_str());
                OutputDebugStringA(string(", msg: " + m_pSslCon->GetSslErrAsString()).c_str());
                if (m_fErrorParam)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError)
                    m_fError(m_pBkRef);
                return -1;
            }
        }
        else
        {
            if (m_fClientConnectedParam)
                m_fClientConnectedParam(reinterpret_cast<SslTcpSocket*>(m_pBkRef), m_pvUserData);
            if (m_fClientConnected)
                m_fClientConnected(reinterpret_cast<SslTcpSocket*>(m_pBkRef));
        }
    }

    int iReturn = -1;
    if (m_iSslInit == 1)
    {
        auto Buffer = make_unique<uint8_t[]>(0x0000ffff);
        int iErrorHint = 0;
        size_t len = m_pSslCon->SslRead(&Buffer[0], 0x0000ffff, &iErrorHint); // get receive data from the SSL layer, and put it into the unencrypted receive Que
        while (len > 0)
        {
            auto tmp = make_unique<uint8_t[]>(len);
            copy_n(&Buffer[0], len, &tmp[0]);
            m_mxInDeque.lock();
            m_quInData.emplace_back(move(tmp), len);
            m_atInBytes += len;
            m_mxInDeque.unlock();
            iReturn = 1;

            len = m_pSslCon->SslRead(&Buffer[0], 0x0000ffff, &iErrorHint); // get receive data from the SSL layer, and put it into the unencrypted receive Que
        }

        bool bNewData = false;
        unique_lock<mutex> lock1(m_mxEnDecode);
        // Get the out Que of the openssl bio, the buffer is already encrypted
        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            size_t anz = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (anz > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += anz;
                m_quOutData.emplace_back(move(temp), anz);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }
        lock1.unlock();

        if (bNewData == true)
            TriggerWriteThread();

        m_mxOutDeque.lock();
        while (m_quTmpOutData.size() > 0)
        {
            DATA data = move(m_quTmpOutData.front());
            m_quTmpOutData.pop_front();
            m_mxOutDeque.unlock();
            Write((&BUFFER(data)[0]), BUFLEN(data));
            m_mxOutDeque.lock();
        }
        m_mxOutDeque.unlock();
        bZeroReceived = m_pSslCon->GetZeroReceived();
    }

    if (nPut != 0 && nPut != nAnzahl)
    {
        OutputDebugString(wstring(L"SslPutInData konnte nicht alles fassen on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
        return DatenDecode(&buffer[nPut], nAnzahl - nPut, bZeroReceived);
    }

    return iReturn;
}